

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O2

int unpack_filename(char *file,char *dir,char *name,char *ver,int checkp)

{
  int iVar1;
  char *pcVar2;
  
  pcVar2 = strrchr(file,0x2f);
  if (pcVar2 == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    if (pcVar2 == file) {
      *dir = '/';
      dir = dir + 1;
    }
    else {
      for (; file != pcVar2; file = file + 1) {
        *dir = *file;
        dir = dir + 1;
      }
    }
    *dir = '\0';
    strcpy(name,pcVar2 + 1);
    separate_version(name,ver,checkp);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int unpack_filename(char *file, char *dir, char *name, char *ver, int checkp)
{
  char *cp;

#ifdef DOS
  if ((cp = (char *)max((UNSIGNED)strrchr(file, DIRSEP), (UNSIGNED)strrchr(file, UNIXDIRSEP))) == 0)
    return (0);

  if (file[1] == DRIVESEP) { /* There's a drive spec; copy it and ignore it from here on. */
    *dir++ = *file++;
    *dir++ = *file++;
  }
#else  /* DOS */
  if ((cp = (char *)strrchr(file, UNIXDIRSEP)) == NULL) return (0);
#endif /* DOS */

  if (cp == file) {
    /* File is on a root directory. */
    *dir = '/';
    *(dir + 1) = '\0';
  } else {
    while (file != cp) *dir++ = *file++;
    *dir = '\0';
  }

  strcpy(name, cp + 1);
  separate_version(name, ver, checkp);
  return (1);
}